

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendScannerProfile
               (cmXMLWriter *xml,string *profileID,bool openActionEnabled,string *openActionFilePath
               ,bool pParserEnabled,string *scannerInfoProviderID,string *runActionArguments,
               string *runActionCommand,bool runActionUseDefault,bool sipParserEnabled)

{
  string *psVar1;
  char *local_188;
  allocator local_179;
  string local_178;
  char *local_158;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  char *local_100;
  allocator local_f1;
  string local_f0;
  char *local_d0;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  bool sipParserEnabled_local;
  string *psStack_38;
  bool runActionUseDefault_local;
  string *scannerInfoProviderID_local;
  string *psStack_28;
  bool pParserEnabled_local;
  string *openActionFilePath_local;
  string *psStack_18;
  bool openActionEnabled_local;
  string *profileID_local;
  cmXMLWriter *xml_local;
  
  local_39 = runActionUseDefault;
  local_3a = sipParserEnabled;
  psStack_38 = scannerInfoProviderID;
  scannerInfoProviderID_local._7_1_ = pParserEnabled;
  psStack_28 = openActionFilePath;
  openActionFilePath_local._7_1_ = openActionEnabled;
  psStack_18 = profileID;
  profileID_local = (string *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"profile",&local_61);
  cmXMLWriter::StartElement(xml,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)profileID_local,"id",psStack_18);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"buildOutputProvider",&local_99);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"openAction",&local_c1);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_d0 = "false";
  if ((openActionFilePath_local._7_1_ & 1) != 0) {
    local_d0 = "true";
  }
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)profileID_local,"enabled",&local_d0);
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)profileID_local,"filePath",psStack_28)
  ;
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"parser",&local_f1);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_100 = "false";
  if ((scannerInfoProviderID_local._7_1_ & 1) != 0) {
    local_100 = "true";
  }
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)profileID_local,"enabled",&local_100);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"scannerInfoProvider",&local_121);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)profileID_local,"id",psStack_38);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"runAction",&local_149);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)profileID_local,"arguments",runActionArguments);
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)profileID_local,"command",runActionCommand);
  local_158 = "false";
  if ((local_39 & 1) != 0) {
    local_158 = "true";
  }
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)profileID_local,"useDefault",&local_158);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  psVar1 = profileID_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"parser",&local_179);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_188 = "false";
  if ((local_3a & 1) != 0) {
    local_188 = "true";
  }
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)profileID_local,"enabled",&local_188);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  cmXMLWriter::EndElement((cmXMLWriter *)profileID_local);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendScannerProfile(
  cmXMLWriter& xml, const std::string& profileID, bool openActionEnabled,
  const std::string& openActionFilePath, bool pParserEnabled,
  const std::string& scannerInfoProviderID,
  const std::string& runActionArguments, const std::string& runActionCommand,
  bool runActionUseDefault, bool sipParserEnabled)
{
  xml.StartElement("profile");
  xml.Attribute("id", profileID);

  xml.StartElement("buildOutputProvider");
  xml.StartElement("openAction");
  xml.Attribute("enabled", openActionEnabled ? "true" : "false");
  xml.Attribute("filePath", openActionFilePath);
  xml.EndElement(); // openAction
  xml.StartElement("parser");
  xml.Attribute("enabled", pParserEnabled ? "true" : "false");
  xml.EndElement(); // parser
  xml.EndElement(); // buildOutputProvider

  xml.StartElement("scannerInfoProvider");
  xml.Attribute("id", scannerInfoProviderID);
  xml.StartElement("runAction");
  xml.Attribute("arguments", runActionArguments);
  xml.Attribute("command", runActionCommand);
  xml.Attribute("useDefault", runActionUseDefault ? "true" : "false");
  xml.EndElement(); // runAction
  xml.StartElement("parser");
  xml.Attribute("enabled", sipParserEnabled ? "true" : "false");
  xml.EndElement(); // parser
  xml.EndElement(); // scannerInfoProvider

  xml.EndElement(); // profile
}